

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::DockBuilderCopyDockSpace
               (ImGuiID src_dockspace_id,ImGuiID dst_dockspace_id,
               ImVector<const_char_*> *in_window_remap_pairs)

{
  int *piVar1;
  undefined8 *puVar2;
  uint uVar3;
  ulong uVar4;
  ImU32 key;
  uint uVar5;
  ImGuiID IVar6;
  int iVar7;
  int *piVar8;
  void *pvVar9;
  ImGuiWindowSettings *pIVar10;
  int iVar11;
  char *__function;
  ulong uVar12;
  long lVar13;
  long lVar14;
  ImVector<unsigned_int> src_windows;
  ImVector<unsigned_int> node_remap_pairs;
  int *local_80;
  int local_78;
  int *piStack_70;
  ImVector<unsigned_int> local_68;
  ulong local_50;
  char *local_48;
  ImVector<const_char_*> *local_40;
  char *local_38;
  
  if (src_dockspace_id == 0) {
    __assert_fail("src_dockspace_id != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/JoelLinn[P]py-mahi-gui/thirdparty/mahi-gui/3rdparty/imgui/imgui.cpp"
                  ,0x3a0e,
                  "void ImGui::DockBuilderCopyDockSpace(ImGuiID, ImGuiID, ImVector<const char *> *)"
                 );
  }
  if (dst_dockspace_id == 0) {
    __assert_fail("dst_dockspace_id != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/JoelLinn[P]py-mahi-gui/thirdparty/mahi-gui/3rdparty/imgui/imgui.cpp"
                  ,0x3a0f,
                  "void ImGui::DockBuilderCopyDockSpace(ImGuiID, ImGuiID, ImVector<const char *> *)"
                 );
  }
  if (in_window_remap_pairs == (ImVector<const_char_*> *)0x0) {
    __assert_fail("in_window_remap_pairs != __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/JoelLinn[P]py-mahi-gui/thirdparty/mahi-gui/3rdparty/imgui/imgui.cpp"
                  ,0x3a10,
                  "void ImGui::DockBuilderCopyDockSpace(ImGuiID, ImGuiID, ImVector<const char *> *)"
                 );
  }
  if ((in_window_remap_pairs->Size & 1) != 0) {
    __assert_fail("(in_window_remap_pairs->Size % 2) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/JoelLinn[P]py-mahi-gui/thirdparty/mahi-gui/3rdparty/imgui/imgui.cpp"
                  ,0x3a11,
                  "void ImGui::DockBuilderCopyDockSpace(ImGuiID, ImGuiID, ImVector<const char *> *)"
                 );
  }
  local_68.Size = 0;
  local_68.Capacity = 0;
  local_68.Data = (uint *)0x0;
  DockBuilderCopyNode(src_dockspace_id,dst_dockspace_id,&local_68);
  local_78 = 0;
  piStack_70 = (int *)0x0;
  iVar11 = in_window_remap_pairs->Size;
  if (iVar11 < 1) {
    lVar14 = 0;
  }
  else {
    local_50 = 0;
    local_80 = (int *)0x0;
    lVar14 = 0;
    uVar12 = 0;
    local_40 = in_window_remap_pairs;
    do {
      if ((long)iVar11 <= (long)(uVar12 | 1)) {
        __function = "T &ImVector<const char *>::operator[](int) [T = const char *]";
        goto LAB_002eec2e;
      }
      local_38 = in_window_remap_pairs->Data[uVar12];
      local_48 = in_window_remap_pairs->Data[uVar12 | 1];
      key = ImHashStr(local_38,0,0);
      iVar11 = (int)local_50;
      piVar8 = local_80;
      uVar4 = local_50;
      if ((int)lVar14 == iVar11) {
        if (iVar11 == 0) {
          uVar5 = 8;
        }
        else {
          uVar5 = ((int)(((uint)(local_50 >> 0x1f) & 1) + iVar11) >> 1) + iVar11;
        }
        uVar3 = iVar11 + 1U;
        if ((int)(iVar11 + 1U) < (int)uVar5) {
          uVar3 = uVar5;
        }
        if (GImGui != (ImGuiContext *)0x0) {
          piVar8 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar8 = *piVar8 + 1;
        }
        piVar8 = (int *)(*GImAllocatorAllocFunc)((long)(int)uVar3 << 2,GImAllocatorUserData);
        in_window_remap_pairs = local_40;
        piStack_70 = piVar8;
        uVar4 = (ulong)uVar3;
        if (local_80 != (int *)0x0) {
          memcpy(piVar8,local_80,(long)(int)local_50 << 2);
          if (GImGui != (ImGuiContext *)0x0) {
            piVar1 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar1 = *piVar1 + -1;
          }
          (*GImAllocatorFreeFunc)(local_80,GImAllocatorUserData);
          in_window_remap_pairs = local_40;
        }
      }
      local_50 = uVar4;
      piVar8[(int)lVar14] = key;
      lVar14 = (long)local_78 + 1;
      local_78 = (int)lVar14;
      pvVar9 = ImGuiStorage::GetVoidPtr(&GImGui->WindowsById,key);
      if (pvVar9 == (void *)0x0) {
        pIVar10 = FindWindowSettings(key);
        if (pIVar10 == (ImGuiWindowSettings *)0x0) {
          IVar6 = 0;
        }
        else {
          IVar6 = pIVar10->DockId;
        }
      }
      else {
        IVar6 = *(ImGuiID *)((long)pvVar9 + 0x438);
      }
      if (0 < local_68.Size) {
        lVar13 = 0;
        do {
          if (local_68.Data[lVar13] == IVar6) {
            if ((uint)local_68.Size <= (uint)(lVar13 + 1U)) goto LAB_002eec19;
            if (local_68.Data[lVar13 + 1U & 0xffffffff] != 0) {
              DockBuilderDockWindow(local_48,local_68.Data[lVar13 + 1U & 0xffffffff]);
              goto LAB_002eeac5;
            }
            break;
          }
          lVar13 = lVar13 + 2;
        } while ((int)lVar13 < local_68.Size);
      }
      DockBuilderCopyWindowSettings(local_38,local_48);
LAB_002eeac5:
      uVar12 = uVar12 + 2;
      iVar11 = in_window_remap_pairs->Size;
      local_80 = piVar8;
    } while ((int)uVar12 < iVar11);
  }
  if (0 < local_68.Size) {
    uVar12 = 0;
    iVar11 = local_68.Size;
    do {
      if (local_68.Data[uVar12] != 0) {
        if ((long)iVar11 <= (long)(uVar12 | 1)) {
LAB_002eec19:
          __function = "T &ImVector<unsigned int>::operator[](int) [T = unsigned int]";
LAB_002eec2e:
          __assert_fail("i >= 0 && i < Size",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/JoelLinn[P]py-mahi-gui/thirdparty/mahi-gui/3rdparty/imgui/imgui.h"
                        ,0x688,__function);
        }
        IVar6 = local_68.Data[uVar12 | 1];
        pvVar9 = ImGuiStorage::GetVoidPtr(&(GImGui->DockContext).Nodes,local_68.Data[uVar12]);
        iVar7 = *(int *)((long)pvVar9 + 0x28);
        if (0 < iVar7) {
          lVar13 = 0;
          do {
            puVar2 = *(undefined8 **)(*(long *)((long)pvVar9 + 0x30) + lVar13 * 8);
            piVar8 = piStack_70;
            do {
              if (piStack_70 + lVar14 <= piVar8) {
                DockBuilderDockWindow((char *)*puVar2,IVar6);
                iVar7 = *(int *)((long)pvVar9 + 0x28);
                break;
              }
              iVar11 = *piVar8;
              piVar8 = piVar8 + 1;
            } while (iVar11 != *(int *)(puVar2 + 1));
            lVar13 = lVar13 + 1;
          } while (lVar13 < iVar7);
          iVar11 = local_68.Size;
        }
      }
      uVar12 = uVar12 + 2;
    } while ((int)uVar12 < iVar11);
  }
  if (piStack_70 != (int *)0x0) {
    if (GImGui != (ImGuiContext *)0x0) {
      piVar8 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar8 = *piVar8 + -1;
    }
    (*GImAllocatorFreeFunc)(piStack_70,GImAllocatorUserData);
  }
  if (local_68.Data != (uint *)0x0) {
    if (GImGui != (ImGuiContext *)0x0) {
      piVar8 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar8 = *piVar8 + -1;
    }
    (*GImAllocatorFreeFunc)(local_68.Data,GImAllocatorUserData);
  }
  return;
}

Assistant:

void ImGui::DockBuilderCopyDockSpace(ImGuiID src_dockspace_id, ImGuiID dst_dockspace_id, ImVector<const char*>* in_window_remap_pairs)
{
    IM_ASSERT(src_dockspace_id != 0);
    IM_ASSERT(dst_dockspace_id != 0);
    IM_ASSERT(in_window_remap_pairs != NULL);
    IM_ASSERT((in_window_remap_pairs->Size % 2) == 0);

    // Duplicate entire dock
    // FIXME: When overwriting dst_dockspace_id, windows that aren't part of our dockspace window class but that are docked in a same node will be split apart,
    // whereas we could attempt to at least keep them together in a new, same floating node.
    ImVector<ImGuiID> node_remap_pairs;
    DockBuilderCopyNode(src_dockspace_id, dst_dockspace_id, &node_remap_pairs);

    // Attempt to transition all the upcoming windows associated to dst_dockspace_id into the newly created hierarchy of dock nodes
    // (The windows associated to src_dockspace_id are staying in place)
    ImVector<ImGuiID> src_windows;
    for (int remap_window_n = 0; remap_window_n < in_window_remap_pairs->Size; remap_window_n += 2)
    {
        const char* src_window_name = (*in_window_remap_pairs)[remap_window_n];
        const char* dst_window_name = (*in_window_remap_pairs)[remap_window_n + 1];
        ImGuiID src_window_id = ImHashStr(src_window_name);
        src_windows.push_back(src_window_id);

        // Search in the remapping tables
        ImGuiID src_dock_id = 0;
        if (ImGuiWindow* src_window = FindWindowByID(src_window_id))
            src_dock_id = src_window->DockId;
        else if (ImGuiWindowSettings* src_window_settings = FindWindowSettings(src_window_id))
            src_dock_id = src_window_settings->DockId;
        ImGuiID dst_dock_id = 0;
        for (int dock_remap_n = 0; dock_remap_n < node_remap_pairs.Size; dock_remap_n += 2)
            if (node_remap_pairs[dock_remap_n] == src_dock_id)
            {
                dst_dock_id = node_remap_pairs[dock_remap_n + 1];
                //node_remap_pairs[dock_remap_n] = node_remap_pairs[dock_remap_n + 1] = 0; // Clear
                break;
            }

        if (dst_dock_id != 0)
        {
            // Docked windows gets redocked into the new node hierarchy.
            IMGUI_DEBUG_LOG_DOCKING("Remap live window '%s' 0x%08X -> '%s' 0x%08X\n", src_window_name, src_dock_id, dst_window_name, dst_dock_id);
            DockBuilderDockWindow(dst_window_name, dst_dock_id);
        }
        else
        {
            // Floating windows gets their settings transferred (regardless of whether the new window already exist or not)
            // When this is leading to a Copy and not a Move, we would get two overlapping floating windows. Could we possibly dock them together?
            IMGUI_DEBUG_LOG_DOCKING("Remap window settings '%s' -> '%s'\n", src_window_name, dst_window_name);
            DockBuilderCopyWindowSettings(src_window_name, dst_window_name);
        }
    }

    // Anything else in the source nodes of 'node_remap_pairs' are windows that were docked in src_dockspace_id but are not owned by it (unaffiliated windows, e.g. "ImGui Demo")
    // Find those windows and move to them to the cloned dock node. This may be optional?
    for (int dock_remap_n = 0; dock_remap_n < node_remap_pairs.Size; dock_remap_n += 2)
        if (ImGuiID src_dock_id = node_remap_pairs[dock_remap_n])
        {
            ImGuiID dst_dock_id = node_remap_pairs[dock_remap_n + 1];
            ImGuiDockNode* node = DockBuilderGetNode(src_dock_id);
            for (int window_n = 0; window_n < node->Windows.Size; window_n++)
            {
                ImGuiWindow* window = node->Windows[window_n];
                if (src_windows.contains(window->ID))
                    continue;

                // Docked windows gets redocked into the new node hierarchy.
                IMGUI_DEBUG_LOG_DOCKING("Remap window '%s' %08X -> %08X\n", window->Name, src_dock_id, dst_dock_id);
                DockBuilderDockWindow(window->Name, dst_dock_id);
            }
        }
}